

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_tile_info(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  undefined8 *local_68;
  int tile_row;
  int tile_col;
  int tile_cols;
  int tile_rows;
  CommonTileParams *tiles;
  AV1Decoder *pbi;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  aom_tile_info *tile_info;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t *ctx_local;
  aom_codec_err_t local_4;
  
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_68 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_68 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = local_68 + 1;
  }
  piVar4 = (int *)*local_68;
  if (piVar4 == (int *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (ctx->frame_worker == (AVxWorker *)0x0) {
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    lVar5 = *ctx->frame_worker->data1;
    iVar2 = *(int *)(lVar5 + 0x9c04);
    iVar3 = *(int *)(lVar5 + 0x9c00);
    if (*(int *)(lVar5 + 0x9c14) == 0) {
      piVar4[1] = iVar2;
      *piVar4 = iVar3;
    }
    else {
      piVar4[1] = 1 << ((byte)*(undefined4 *)(lVar5 + 0x9c1c) & 0x1f);
      *piVar4 = 1 << ((byte)*(undefined4 *)(lVar5 + 0x9c18) & 0x1f);
    }
    for (tile_col = 1; tile_col <= iVar3; tile_col = tile_col + 1) {
      piVar4[(long)(tile_col + -1) + 2] =
           *(int *)(lVar5 + 0x9c3c + (long)tile_col * 4) -
           *(int *)(lVar5 + 0x9c3c + (long)(tile_col + -1) * 4);
    }
    for (tile_row = 1; tile_row <= iVar2; tile_row = tile_row + 1) {
      piVar4[(long)(tile_row + -1) + 0x42] =
           *(int *)(lVar5 + 0x9d40 + (long)tile_row * 4) -
           *(int *)(lVar5 + 0x9d40 + (long)(tile_row + -1) * 4);
    }
    piVar4[0x82] = *(int *)(lVar5 + 0x5f758);
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_tile_info(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  aom_tile_info *const tile_info = va_arg(args, aom_tile_info *);

  if (tile_info) {
    if (ctx->frame_worker) {
      AVxWorker *const worker = ctx->frame_worker;
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1Decoder *pbi = frame_worker_data->pbi;
      const CommonTileParams *tiles = &pbi->common.tiles;

      int tile_rows = tiles->rows;
      int tile_cols = tiles->cols;

      if (tiles->uniform_spacing) {
        tile_info->tile_rows = 1 << tiles->log2_rows;
        tile_info->tile_columns = 1 << tiles->log2_cols;
      } else {
        tile_info->tile_rows = tile_rows;
        tile_info->tile_columns = tile_cols;
      }

      for (int tile_col = 1; tile_col <= tile_cols; tile_col++) {
        tile_info->tile_widths[tile_col - 1] =
            tiles->col_start_sb[tile_col] - tiles->col_start_sb[tile_col - 1];
      }

      for (int tile_row = 1; tile_row <= tile_rows; tile_row++) {
        tile_info->tile_heights[tile_row - 1] =
            tiles->row_start_sb[tile_row] - tiles->row_start_sb[tile_row - 1];
      }
      tile_info->num_tile_groups = pbi->num_tile_groups;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}